

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O3

ssize_t __thiscall DomPointF::write(DomPointF *this,int __fd,void *__buf,size_t __n)

{
  uint uVar1;
  undefined4 in_register_00000034;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar2;
  long in_FS_OFFSET;
  QAnyStringView QVar3;
  QAnyStringView QVar4;
  QAnyStringView QVar5;
  QAnyStringView QVar6;
  QAnyStringView QVar7;
  QString local_40;
  long local_28;
  
  aVar2._4_4_ = in_register_00000034;
  aVar2._0_4_ = __fd;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)((long)__buf + 0x10) == 0) {
    local_40.d.d = (Data *)0x0;
    local_40.d.ptr = L"pointf";
    local_40.d.size = 6;
  }
  else {
    QString::toLower_helper(&local_40);
  }
  QVar3.m_size = (size_t)local_40.d.ptr;
  QVar3.field_0.m_data = aVar2.m_data;
  QXmlStreamWriter::writeStartElement(QVar3);
  if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
    }
  }
  uVar1 = this->m_children;
  if ((uVar1 & 1) != 0) {
    QString::number(this->m_x,(char)&local_40,0x66);
    QVar4.m_size = (size_t)L"x";
    QVar4.field_0.m_data = aVar2.m_data;
    QVar6.m_size = (size_t)local_40.d.ptr;
    QVar6.field_0 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)(void *)0x8000000000000001;
    QXmlStreamWriter::writeTextElement(QVar4,QVar6);
    if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
      }
    }
    uVar1 = this->m_children;
  }
  if ((uVar1 & 2) != 0) {
    QString::number(this->m_y,(char)&local_40,0x66);
    QVar5.m_size = (size_t)L"y";
    QVar5.field_0.m_data = aVar2.m_data;
    QVar7.m_size = (size_t)local_40.d.ptr;
    QVar7.field_0 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)(void *)0x8000000000000001;
    QXmlStreamWriter::writeTextElement(QVar5,QVar7);
    if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  QXmlStreamWriter::writeEndElement();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return *(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void DomPointF::write(QXmlStreamWriter &writer, const QString &tagName) const
{
    writer.writeStartElement(tagName.isEmpty() ? QStringLiteral("pointf") : tagName.toLower());

    if (m_children & X)
        writer.writeTextElement(u"x"_s, QString::number(m_x, 'f', 15));

    if (m_children & Y)
        writer.writeTextElement(u"y"_s, QString::number(m_y, 'f', 15));

    writer.writeEndElement();
}